

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_enum_udev.c
# Opt level: O2

int igsc_device_iterator_create(igsc_device_iterator **iter)

{
  long lVar1;
  int iVar2;
  igsc_device_iterator *__ptr;
  udev *puVar3;
  udev_enumerate *puVar4;
  igsc_log_func_t p_Var5;
  char *pcVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  undefined8 uStackY_d0;
  char __time_buf [128];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (iter == (igsc_device_iterator **)0x0) {
    p_Var5 = igsc_get_log_callback_func();
    if (p_Var5 == (igsc_log_func_t)0x0) {
      pcVar6 = gsc_time(__time_buf,0x80);
      iVar2 = 3;
      syslog(3,"%s: IGSC: (%s:%s():%d) Bad parameters\n",pcVar6,
             "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/enum/igsc_enum_udev.c"
             ,"igsc_device_iterator_create",0x22);
    }
    else {
      p_Var5 = igsc_get_log_callback_func();
      pcVar6 = gsc_time(__time_buf,0x80);
      (*p_Var5)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Bad parameters\n",pcVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/enum/igsc_enum_udev.c"
                ,"igsc_device_iterator_create",0x22);
      iVar2 = 3;
    }
    goto LAB_0011c82f;
  }
  __ptr = (igsc_device_iterator *)calloc(1,0x18);
  if (__ptr == (igsc_device_iterator *)0x0) {
    p_Var5 = igsc_get_log_callback_func();
    if (p_Var5 == (igsc_log_func_t)0x0) {
      pcVar6 = gsc_time(__time_buf,0x80);
      syslog(3,"%s: IGSC: (%s:%s():%d) Can\'t allocate iterator\n",pcVar6,
             "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/enum/igsc_enum_udev.c"
             ,"igsc_device_iterator_create",0x29);
    }
    else {
      p_Var5 = igsc_get_log_callback_func();
      pcVar6 = gsc_time(__time_buf,0x80);
      (*p_Var5)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Can\'t allocate iterator\n",pcVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/enum/igsc_enum_udev.c"
                ,"igsc_device_iterator_create",0x29);
    }
    iVar2 = 2;
    goto LAB_0011c82f;
  }
  puVar3 = (udev *)udev_new();
  __ptr->udev = puVar3;
  if (puVar3 == (udev *)0x0) {
    p_Var5 = igsc_get_log_callback_func();
    if (p_Var5 == (igsc_log_func_t)0x0) {
      pcVar6 = gsc_time(__time_buf,0x80);
      syslog(3,"%s: IGSC: (%s:%s():%d) Cannot create udev\n",pcVar6,
             "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/enum/igsc_enum_udev.c"
             ,"igsc_device_iterator_create",0x30);
    }
    else {
      p_Var5 = igsc_get_log_callback_func();
      pcVar6 = gsc_time(__time_buf,0x80);
      (*p_Var5)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Cannot create udev\n",pcVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/enum/igsc_enum_udev.c"
                ,"igsc_device_iterator_create",0x30);
    }
  }
  else {
    puVar4 = (udev_enumerate *)udev_enumerate_new(puVar3);
    __ptr->enumerate = puVar4;
    if (puVar4 == (udev_enumerate *)0x0) {
      p_Var5 = igsc_get_log_callback_func();
      if (p_Var5 == (igsc_log_func_t)0x0) {
        pcVar6 = gsc_time(__time_buf,0x80);
        syslog(3,"%s: IGSC: (%s:%s():%d) Cannot create udev_enumerate\n",pcVar6,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/enum/igsc_enum_udev.c"
               ,"igsc_device_iterator_create",0x38);
      }
      else {
        p_Var5 = igsc_get_log_callback_func();
        pcVar6 = gsc_time(__time_buf,0x80);
        (*p_Var5)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Cannot create udev_enumerate\n",
                  pcVar6,
                  "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/enum/igsc_enum_udev.c"
                  ,"igsc_device_iterator_create",0x38);
      }
    }
    else {
      iVar2 = udev_enumerate_add_match_sysattr(puVar4,"kind","gscfi");
      if (iVar2 < 0) {
        p_Var5 = igsc_get_log_callback_func();
        if (p_Var5 != (igsc_log_func_t)0x0) {
          p_Var5 = igsc_get_log_callback_func();
          pcVar6 = gsc_time(__time_buf,0x80);
          pcVar7 = "%s: IGSC: (%s:%s():%d) Cannot match udev sysattr: %d\n";
          uStackY_d0 = 0x3f;
          goto LAB_0011c766;
        }
        pcVar6 = gsc_time(__time_buf,0x80);
        pcVar7 = "%s: IGSC: (%s:%s():%d) Cannot match udev sysattr: %d\n";
        uStackY_d0 = 0x3f;
LAB_0011c808:
        syslog(3,pcVar7,pcVar6,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/enum/igsc_enum_udev.c"
               ,"igsc_device_iterator_create",uStackY_d0,iVar2);
      }
      else {
        iVar2 = udev_enumerate_scan_devices(puVar4);
        if (-1 < iVar2) {
          *iter = __ptr;
          iVar2 = 0;
          goto LAB_0011c82f;
        }
        p_Var5 = igsc_get_log_callback_func();
        if (p_Var5 == (igsc_log_func_t)0x0) {
          pcVar6 = gsc_time(__time_buf,0x80);
          pcVar7 = "%s: IGSC: (%s:%s():%d) Cannot scan udev devices: %d\n";
          uStackY_d0 = 0x46;
          goto LAB_0011c808;
        }
        p_Var5 = igsc_get_log_callback_func();
        pcVar6 = gsc_time(__time_buf,0x80);
        pcVar7 = "%s: IGSC: (%s:%s():%d) Cannot scan udev devices: %d\n";
        uStackY_d0 = 0x46;
LAB_0011c766:
        (*p_Var5)(IGSC_LOG_LEVEL_ERROR,pcVar7,pcVar6,
                  "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/enum/igsc_enum_udev.c"
                  ,"igsc_device_iterator_create",uStackY_d0,iVar2);
      }
      udev_enumerate_unref(puVar4);
    }
    udev_unref(puVar3);
  }
  free(__ptr);
  iVar2 = 1;
LAB_0011c82f:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

int igsc_device_iterator_create(struct igsc_device_iterator **iter)
{
    struct igsc_device_iterator *it = NULL;
    int ret;

    if (iter == NULL)
    {
        gsc_error("Bad parameters\n");
        return IGSC_ERROR_INVALID_PARAMETER;
    }

    it = calloc(1, sizeof(*it));
    if (it == NULL)
    {
        gsc_error("Can't allocate iterator\n");
        return IGSC_ERROR_NOMEM;
    }

    it->udev = udev_new();
    if (it->udev == NULL)
    {
        gsc_error("Cannot create udev\n");
        ret = IGSC_ERROR_INTERNAL;
        goto clean_iter;
    }

    it->enumerate = udev_enumerate_new(it->udev);
    if (!it->enumerate)
    {
        gsc_error("Cannot create udev_enumerate\n");
        ret = IGSC_ERROR_INTERNAL;
        goto clean_udev;
    }

    if ((ret = udev_enumerate_add_match_sysattr(it->enumerate, "kind", "gscfi")) < 0)
    {
        gsc_error("Cannot match udev sysattr: %d\n", ret);
        ret = IGSC_ERROR_INTERNAL;
        goto clean_enum;
    }

    if ((ret = udev_enumerate_scan_devices(it->enumerate)) < 0)
    {
        gsc_error("Cannot scan udev devices: %d\n", ret);
        ret = IGSC_ERROR_INTERNAL;
        goto clean_enum;
    }
    it->entry = NULL;
    *iter = it;

    return IGSC_SUCCESS;
clean_enum:
    udev_enumerate_unref(it->enumerate);
clean_udev:
    udev_unref(it->udev);
clean_iter:
    free(it);
    return ret;
}